

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  logic_error *this_00;
  string local_30;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    toLower(&local_30,&testCase->name);
    bVar1 = std::operator==(&this->m_name,&local_30);
    break;
  case WildcardAtStart:
    toLower(&local_30,&testCase->name);
    bVar1 = endsWith(&local_30,&this->m_name);
    break;
  case WildcardAtEnd:
    toLower(&local_30,&testCase->name);
    bVar1 = startsWith(&local_30,&this->m_name);
    break;
  case WildcardAtBothEnds:
    toLower(&local_30,&testCase->name);
    bVar1 = contains(&local_30,&this->m_name);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                switch( m_wildcard ) {
                    case NoWildcard:
                        return m_name == toLower( testCase.name );
                    case WildcardAtStart:
                        return endsWith( toLower( testCase.name ), m_name );
                    case WildcardAtEnd:
                        return startsWith( toLower( testCase.name ), m_name );
                    case WildcardAtBothEnds:
                        return contains( toLower( testCase.name ), m_name );
                }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
                throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
            }